

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<const_ot::commissioner::EnergyReport_*> *
testing::internal::ActionResultHolder<ot::commissioner::EnergyReport_const*>::
PerformAction<ot::commissioner::EnergyReport_const*(ot::commissioner::Address_const&)>
          (Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *action
          ,ArgumentTuple *args)

{
  ArgumentTuple *this;
  ActionResultHolder<const_ot::commissioner::EnergyReport_*> *this_00;
  Result value;
  tuple<const_ot::commissioner::Address_&> local_28;
  Wrapper local_20;
  tuple<const_ot::commissioner::Address_&> *local_18;
  ArgumentTuple *args_local;
  Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this_00 = (ActionResultHolder<const_ot::commissioner::EnergyReport_*> *)operator_new(0x10);
  this = args_local;
  std::tuple<const_ot::commissioner::Address_&>::tuple(&local_28,local_18);
  value = Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::Perform
                    ((Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
                      *)this,&local_28);
  ReferenceOrValueWrapper<const_ot::commissioner::EnergyReport_*>::ReferenceOrValueWrapper
            (&local_20,value);
  ActionResultHolder<const_ot::commissioner::EnergyReport_*>::ActionResultHolder(this_00,local_20);
  return this_00;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }